

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O1

void gen_evmwsmi(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 pTVar1;
  TCGTemp *a1;
  TCGTemp *a1_00;
  ulong uVar2;
  uintptr_t o;
  uintptr_t o_3;
  TCGv_i64 ret;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  
  if (ctx->spe_enabled != false) {
    s = ctx->uc->tcg_ctx;
    a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)a1 - (long)s);
    a1_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)a1_00 - (long)s);
    if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != ret_00) {
      tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,
                        (TCGArg)(cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] + (long)s));
    }
    tcg_gen_ext32s_i64_ppc64(s,ret_00,ret_00);
    pTVar1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    if (pTVar1 != ret) {
      tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(pTVar1 + (long)s));
    }
    tcg_gen_ext32s_i64_ppc64(s,ret,ret);
    tcg_gen_op3_ppc64(s,INDEX_op_mul_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a1_00);
    uVar2 = (ulong)(ctx->opcode >> 0x12 & 0xf8);
    tcg_gen_extr32_i64_ppc64
              (s,*(TCGv_i64 *)((long)cpu_gpr + uVar2),*(TCGv_i64 *)((long)cpu_gprh + uVar2),ret_00);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
    return;
  }
  gen_exception(ctx,0x20);
  return;
}

Assistant:

static inline void gen_evmwsmi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0, t1;

    if (unlikely(!ctx->spe_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_SPEU);
        return;
    }

    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);

    /* t0 := rA; t1 := rB */
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_ext32s_i64(tcg_ctx, t0, t0);
    tcg_gen_extu_tl_i64(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_ext32s_i64(tcg_ctx, t1, t1);

    tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);  /* t0 := rA * rB */

    gen_store_gpr64(tcg_ctx, rD(ctx->opcode), t0); /* rD := t0 */

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}